

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

int conf_parse_file(char *file,proxy_conf *conf,log_handle *log)

{
  FILE *__stream;
  int *piVar1;
  int ret;
  FILE *stream;
  log_handle *log_local;
  proxy_conf *conf_local;
  char *file_local;
  
  log_printf(log,LOG_LEVEL_DEBUG,"Loading proxy config from \'%s\'\n",file);
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    piVar1 = __errno_location();
    file_local._4_4_ = -*piVar1;
  }
  else {
    file_local._4_4_ = conf_parse_stream((FILE *)__stream,conf,log);
    fclose(__stream);
  }
  return file_local._4_4_;
}

Assistant:

int conf_parse_file(const char *file, struct proxy_conf *conf,
		    struct log_handle *log)
{
	FILE *stream;
	int ret;

	log_printf(log, LOG_LEVEL_DEBUG, "Loading proxy config from '%s'\n", file);

	stream = fopen(file, "r");
	if (stream == NULL)
		return -errno;

	ret = conf_parse_stream(stream, conf, log);

	fclose(stream);

	return ret;
}